

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  __u32 _Var2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  isobusfs_srv_priv *piVar8;
  char **__ptr;
  sockaddr_can_conflict *psVar9;
  __time_t __ptr_00;
  int iVar10;
  uint uVar11;
  wchar_t wVar12;
  isobusfs_srv_priv_conflict *priv;
  char *__string;
  size_t sVar13;
  epoll_event *peVar14;
  isobusfs_msg *msg;
  int *piVar15;
  isobusfs_srv_client *piVar16;
  void *pvVar17;
  long lVar18;
  undefined8 uVar19;
  wchar_t *volumes;
  int *extraout_RDX;
  ulong uVar20;
  _Bool *p_Var21;
  timespec *optarg;
  char *pcVar22;
  char *pcVar23;
  bool bVar24;
  uint n;
  long lVar25;
  char **ppcVar26;
  ulong uVar27;
  ulong uVar28;
  int writeable_volumes_count;
  uint32_t local_address;
  char **writeable_volumes;
  wchar_t *local_1d0;
  int long_index;
  ulong local_1c0;
  uint64_t local_name;
  sockaddr_can_conflict *local_1b0;
  timespec ts;
  sockaddr_can local_198 [15];
  
  priv = (isobusfs_srv_priv_conflict *)calloc(1,0x16c2c0);
  if (priv == (isobusfs_srv_priv_conflict *)0x0) {
    pcVar23 = "can\'t allocate priv";
    pcVar22 = (char *)0x1;
    err();
    if (*extraout_RDX < 10) {
      pcVar22 = strdup(pcVar22);
      pcVar22 = strtok(pcVar22,",");
      iVar10 = 0;
      while (pcVar22 != (char *)0x0) {
        iVar3 = *extraout_RDX;
        *extraout_RDX = iVar3 + 1;
        pvVar17 = realloc(*(void **)pcVar23,(long)iVar3 * 8 + 8);
        *(void **)pcVar23 = pvVar17;
        pcVar22 = strdup(pcVar22);
        **(undefined8 **)(pcVar23 + ((long)*extraout_RDX + -1) * 8) = pcVar22;
        pcVar22 = strtok((char *)0x0,",");
      }
    }
    else {
      isobusfs_log(1,"Maximum number of volumes (%d) exceeded\n",10);
      iVar10 = -0x16;
    }
    return iVar10;
  }
  local_1b0 = &priv->addr;
  libj1939_init_sockaddr_can((sockaddr_can *)local_1b0,0x40000);
  priv->server_version = L'\x04';
  ts.tv_sec = 0;
  writeable_volumes = (char **)0x0;
  local_address = 0;
  local_name = 0;
  writeable_volumes_count = 0;
  long_index = 0;
  memcpy(local_198,&PTR_anon_var_dwarf_81_0010cc60,0x160);
  local_1d0 = &priv->removable_volumes_count;
  bVar7 = false;
  bVar24 = false;
  local_1c0 = 0;
  bVar6 = false;
LAB_001026fb:
  iVar10 = getopt_long(argc,argv,"a:d:i:l:n:r:s:v:w:h",local_198,&long_index);
  piVar15 = (int *)(ulong)(iVar10 - 100);
  switch(piVar15) {
  case (int *)0x0:
    pcVar22 = strdup((char *)_optarg);
    priv->default_volume = pcVar22;
    goto LAB_001026fb;
  case (int *)0x1:
  case (int *)0x2:
  case (int *)0x3:
  case (int *)0x4:
  case (int *)0x6:
  case (int *)0x7:
  case (int *)0x9:
  case (int *)0xb:
  case (int *)0xc:
  case (int *)0xd:
  case (int *)0x10:
  case (int *)0x11:
    goto switchD_00102725_caseD_1;
  case (int *)0x5:
    wVar12 = if_nametoindex((char *)_optarg);
    (priv->addr).can_ifindex = wVar12;
    piVar8 = _optarg;
    local_1c0 = CONCAT71((int7)((ulong)piVar15 >> 8),1);
    if (wVar12 == L'\0') {
      piVar15 = __errno_location();
      iVar10 = *piVar15;
      pcVar22 = strerror(iVar10);
      isobusfs_log(1,"Interface %s not found. Error: %d (%s)\n",piVar8,iVar10,pcVar22);
      return -0x16;
    }
    goto LAB_001026fb;
  case (int *)0x8:
    uVar20 = strtoul((char *)_optarg,(char **)0x0,0);
    if ((int)uVar20 - 5U < 0xfffffffc) {
      isobusfs_log(1,"invalid debug level %d",uVar20 & 0xffffffff);
    }
    isobusfs_log_level_set(uVar20 & 0xffffffff);
    goto LAB_001026fb;
  case (int *)0xa:
    if (bVar6) goto LAB_00102a48;
    __isoc99_sscanf(_optarg,"%lx",&local_name);
    priv->local_name = local_name;
    (priv->addr).can_addr.j1939.name = local_name;
    bVar7 = true;
    goto LAB_001026fb;
  case (int *)0xe:
    optarg = &ts;
    volumes = local_1d0;
    break;
  case (int *)0xf:
    uVar11 = atoi((char *)_optarg);
    if (0xff < uVar11) {
      isobusfs_log(1,"Invalid server version %d. Using default version: %d",uVar11,4);
    }
    goto LAB_001026fb;
  case (int *)0x12:
    if (L'\t' < priv->volume_count) {
      isobusfs_log(1,"Maximum number of volumes (%d) exceeded\n",10);
      return -0x16;
    }
    pcVar22 = strdup((char *)_optarg);
    pcVar23 = strtok(pcVar22,":");
    __string = strtok((char *)0x0,":");
    if (pcVar23 == (char *)0x0 || __string == (char *)0x0) {
      isobusfs_log(1,"Error: volume or path name is missing\n");
LAB_00102979:
      bVar5 = false;
      bVar4 = true;
      wVar12 = L'\xffffffea';
    }
    else {
      sVar13 = strnlen(pcVar23,0x100);
      if (0xfe < sVar13) {
        pcVar23 = "Error: Volume name exceeds maximum length (%d)\n";
        uVar19 = 0xfe;
LAB_00102972:
        isobusfs_log(1,pcVar23,uVar19);
        goto LAB_00102979;
      }
      sVar13 = strnlen(__string,0x1002);
      if (0x1000 < sVar13) {
        pcVar23 = "Error: Path name exceeds maximum length (%d)\n";
        uVar19 = 0x1000;
        goto LAB_00102972;
      }
      pcVar23 = strdup(pcVar23);
      priv->volumes[priv->volume_count].name = pcVar23;
      pcVar23 = strdup(__string);
      wVar12 = priv->volume_count;
      priv->volumes[wVar12].path = pcVar23;
      priv->volume_count = wVar12 + L'\x01';
      bVar4 = false;
      bVar5 = true;
      wVar12 = L'\0';
    }
    free(pcVar22);
    bVar24 = true;
    if (bVar4) goto LAB_00102aad;
    goto LAB_001026fb;
  case (int *)0x13:
    optarg = (timespec *)&writeable_volumes;
    volumes = &writeable_volumes_count;
    break;
  default:
    if (iVar10 != 0x61) {
      if (iVar10 != -1) goto switchD_00102725_caseD_1;
      if ((!bVar6) && (!bVar7)) {
        pcVar22 = "Error: local address or local name is missing";
        goto LAB_00102c9d;
      }
      if (bVar24) {
        if ((local_1c0 & 1) == 0) {
          pcVar22 = "Error: interface is missing";
          goto LAB_00102c9d;
        }
        wVar12 = priv->volume_count;
        uVar20 = (ulong)(uint)wVar12;
        if (uVar20 == 1) {
          if (priv->default_volume != (char *)0x0) {
            pcVar22 = "Error: default volume is not needed for single volume";
            goto LAB_00102c9d;
          }
          pcVar22 = strdup(priv->volumes[0].name);
          priv->default_volume = pcVar22;
          goto LAB_00102d56;
        }
        if (wVar12 != L'\0') {
          if (wVar12 < L'\x02') goto LAB_00102d56;
          pcVar22 = priv->default_volume;
          if (pcVar22 != (char *)0x0) {
            lVar25 = 0;
            goto LAB_00102d11;
          }
          pcVar22 = "Error: default volume is missing";
          goto LAB_00102c9d;
        }
      }
      pcVar22 = "Error: volume is missing";
      goto LAB_00102c9d;
    }
    if (bVar7) {
LAB_00102a48:
      isobusfs_log(1,"Both local address and local name provided, they are mutually exclusive\n");
      return -0x16;
    }
    __isoc99_sscanf(_optarg,"%x",&local_address);
    (priv->addr).can_addr.j1939.addr = (__u8)local_address;
    bVar6 = true;
    goto LAB_001026fb;
  }
  iVar10 = isobusfs_srv_parse_volume_ext(_optarg,(char *)optarg,(char ***)volumes,piVar15);
  if (iVar10 < 0) {
    return iVar10;
  }
  goto LAB_001026fb;
LAB_00102d11:
  if ((uVar20 * 0x780 - lVar25 == 0) ||
     (iVar10 = strcmp(pcVar22,*(char **)((long)priv->volumes[0].clients + lVar25 + -0x18)),
     iVar10 == 0)) goto LAB_00102d56;
  lVar25 = lVar25 + 0x780;
  if ((ulong)(uint)(wVar12 + L'\xffffffff') * 0x780 + 0x780 == lVar25) {
    pcVar22 = "Error: default volume should be one of defined volumes";
LAB_00102c9d:
    isobusfs_log(1,pcVar22);
switchD_00102725_caseD_1:
    isobusfs_srv_print_help();
    return -0x16;
  }
  goto LAB_00102d11;
LAB_00102aad:
  if (!bVar5) {
    return wVar12;
  }
  goto LAB_00102ab8;
LAB_00102d56:
  __ptr_00 = ts.tv_sec;
  uVar28 = 0;
  uVar27 = (ulong)(uint)*local_1d0;
  if (*local_1d0 < L'\x01') {
    uVar27 = uVar28;
  }
  for (; __ptr = writeable_volumes, uVar28 != uVar27; uVar28 = uVar28 + 1) {
    lVar25 = 0;
    do {
      lVar18 = lVar25;
      if (uVar20 * 0x780 + 0x780 == lVar18 + 0x780) {
        pcVar22 = *(char **)(__ptr_00 + (uVar28 & 0xffffffff) * 8);
        pcVar23 = "Error: removable volume %s is not defined";
        goto LAB_00102dcc;
      }
      iVar10 = strcmp(*(char **)(__ptr_00 + uVar28 * 8),
                      *(char **)((long)priv->volumes[0].clients + lVar18 + -0x18));
      lVar25 = lVar18 + 0x780;
    } while (iVar10 != 0);
    *(undefined1 *)((long)priv->volumes[0].clients + lVar18 + -8) = 1;
  }
  uVar28 = 0;
  uVar27 = (ulong)(uint)writeable_volumes_count;
  if (writeable_volumes_count < 1) {
    uVar27 = uVar28;
  }
  for (; uVar28 != uVar27; uVar28 = uVar28 + 1) {
    lVar25 = 0;
    do {
      lVar18 = lVar25;
      if (uVar20 * 0x780 + 0x780 == lVar18 + 0x780) {
        pcVar22 = __ptr[uVar28 & 0xffffffff];
        pcVar23 = "Error: writeable volume %s is not defined";
LAB_00102dcc:
        isobusfs_log(1,pcVar23,pcVar22);
        goto switchD_00102725_caseD_1;
      }
      iVar10 = strcmp(__ptr[uVar28],*(char **)((long)priv->volumes[0].clients + lVar18 + -0x18));
      lVar25 = lVar18 + 0x780;
    } while (iVar10 != 0);
    *(undefined1 *)((long)priv->volumes[0].clients + lVar18 + -7) = 1;
  }
  ppcVar26 = &priv->volumes[0].path;
  for (lVar25 = 0; lVar25 < (int)uVar20; lVar25 = lVar25 + 1) {
    iVar10 = isobusfs_cmn_dh_validate_dir_path(*ppcVar26,*(_Bool *)((long)ppcVar26 + 9));
    if (iVar10 < 0) {
      if (iVar10 == -0xd) {
        pcVar22 = *ppcVar26;
        pcVar23 = strerror(-0xd);
        isobusfs_log(1,"Error: can\'t access path %s, error %i (%s)",pcVar22,0xfffffffffffffff3,
                     pcVar23);
      }
      else if (iVar10 == -0x14) {
        isobusfs_log(1,"Error: path %s is not a directory",*ppcVar26);
      }
      if (*(_Bool *)(ppcVar26 + 1) != true) {
        return iVar10;
      }
    }
    uVar20 = (ulong)(uint)priv->volume_count;
    ppcVar26 = ppcVar26 + 0xf0;
  }
  if (!bVar7) {
    isobusfs_log(2,
                 "local name is not set. Wont be able to generate proper manufacturer-specific directory name. Falling mack to MCMC0000"
                );
  }
  snprintf(priv->mfs_dir,9,"MCMC%04u");
  isobusfs_log(4,"Server configuration:");
  isobusfs_log(4,"  local NAME: 0x%lx",priv->local_name);
  isobusfs_log(4,"  manufacturer-specific directory: %s",priv->mfs_dir);
  isobusfs_log(4,"Configured volumes:");
  p_Var21 = &priv->volumes[0].writeable;
  for (lVar25 = 0; lVar25 < priv->volume_count; lVar25 = lVar25 + 1) {
    isobusfs_log(4,"  %s: %s",((isobusfs_srv_volume_conflict *)(p_Var21 + -0x11))->name);
    pcVar22 = "read-only";
    if (*p_Var21 != false) {
      pcVar22 = "writeable";
    }
    isobusfs_log(4,"    %s",pcVar22);
    pcVar22 = "non-removable";
    if (p_Var21[-1] != false) {
      pcVar22 = "removable";
    }
    isobusfs_log(4,"    %s",pcVar22);
    p_Var21 = p_Var21 + 0x780;
  }
  for (lVar25 = 0; lVar25 < *local_1d0; lVar25 = lVar25 + 1) {
    free(*(void **)(__ptr_00 + lVar25 * 8));
  }
  free((void *)__ptr_00);
  for (uVar20 = 0; uVar27 != uVar20; uVar20 = uVar20 + 1) {
    free(__ptr[uVar20]);
  }
  free(__ptr);
LAB_00102ab8:
  wVar12 = libj1939_create_epoll();
  if (L'\xffffffff' < wVar12) {
    (priv->cmn).epoll_fd = wVar12;
    peVar14 = (epoll_event *)calloc(0x100,0xc);
    psVar9 = local_1b0;
    (priv->cmn).epoll_events = peVar14;
    if (peVar14 == (epoll_event *)0x0) {
      wVar12 = L'\xfffffff4';
    }
    else {
      (priv->cmn).epoll_events_size = 0x100;
      local_198[0].can_addr._8_8_ = *(undefined8 *)((long)&local_1b0->can_addr + 8);
      local_198[0].can_family = local_1b0->can_family;
      local_198[0]._2_2_ = *(undefined2 *)&local_1b0->field_0x2;
      local_198[0].can_ifindex = local_1b0->can_ifindex;
      local_198[0].can_addr._0_8_ = (local_1b0->can_addr).tp;
      wVar12 = libj1939_open_socket();
      if (L'\xffffffff' < wVar12) {
        priv->sock_fss = wVar12;
        wVar12 = isobusfs_cmn_configure_error_queue(wVar12);
        if (L'\xffffffff' < wVar12) {
          local_198[0].can_addr._8_4_ = 0xaa00;
          wVar12 = libj1939_bind_socket(priv->sock_fss,local_198);
          if ((((L'\xffffffff' < wVar12) &&
               (wVar12 = libj1939_set_broadcast(priv->sock_fss), L'\xffffffff' < wVar12)) &&
              (wVar12 = isobusfs_cmn_set_linger(priv->sock_fss), L'\xffffffff' < wVar12)) &&
             (wVar12 = libj1939_socket_prio(priv->sock_fss,5), L'\xffffffff' < wVar12)) {
            local_198[0].can_addr.j1939.name = 0;
            local_198[0].can_addr._8_5_ = 0xff00000000;
            local_198[0].can_addr._8_4_ = 0xab00;
            wVar12 = isobusfs_cmn_connect_socket(priv->sock_fss);
            if ((L'\xffffffff' < wVar12) &&
               (wVar12 = libj1939_add_socket_to_epoll((priv->cmn).epoll_fd,priv->sock_fss,8),
               L'\xffffffff' < wVar12)) {
              local_198[0].can_addr._8_8_ = *(undefined8 *)((long)&psVar9->can_addr + 8);
              local_198[0].can_family = psVar9->can_family;
              local_198[0]._2_2_ = *(undefined2 *)&psVar9->field_0x2;
              local_198[0].can_ifindex = psVar9->can_ifindex;
              local_198[0].can_addr._0_8_ = (psVar9->can_addr).tp;
              wVar12 = libj1939_open_socket();
              if (L'\xffffffff' < wVar12) {
                priv->sock_in = wVar12;
                local_198[0].can_addr._8_4_ = 0xaa00;
                wVar12 = libj1939_bind_socket(wVar12,local_198);
                if ((L'\xffffffff' < wVar12) &&
                   (wVar12 = libj1939_add_socket_to_epoll((priv->cmn).epoll_fd,priv->sock_in,1),
                   L'\xffffffff' < wVar12)) {
                  local_198[0].can_addr._8_8_ = *(undefined8 *)((long)&psVar9->can_addr + 8);
                  local_198[0].can_family = psVar9->can_family;
                  local_198[0]._2_2_ = *(undefined2 *)&psVar9->field_0x2;
                  local_198[0].can_ifindex = psVar9->can_ifindex;
                  local_198[0].can_addr._0_8_ = (psVar9->can_addr).tp;
                  wVar12 = libj1939_open_socket();
                  if (L'\xffffffff' < wVar12) {
                    priv->sock_nack = wVar12;
                    local_198[0].can_addr._8_4_ = 0xe800;
                    wVar12 = libj1939_bind_socket(wVar12,local_198);
                    if (((L'\xffffffff' < wVar12) &&
                        (wVar12 = libj1939_socket_prio(priv->sock_nack,6), L'\xffffffff' < wVar12))
                       && (wVar12 = libj1939_add_socket_to_epoll
                                              ((priv->cmn).epoll_fd,priv->sock_nack,1),
                          wVar12 == L'\0')) {
                      isobusfs_srv_fss_init((isobusfs_srv_priv *)priv);
                      isobusfs_srv_init_clients((isobusfs_srv_priv *)priv);
                      clock_gettime(1,(timespec *)&ts);
                      *(undefined4 *)&(priv->cmn).next_send_time.tv_sec = (undefined4)ts.tv_sec;
                      *(undefined4 *)((long)&(priv->cmn).next_send_time.tv_sec + 4) =
                           ts.tv_sec._4_4_;
                      *(undefined4 *)&(priv->cmn).next_send_time.tv_nsec = (undefined4)ts.tv_nsec;
                      *(undefined4 *)((long)&(priv->cmn).next_send_time.tv_nsec + 4) =
                           ts.tv_nsec._4_4_;
                      isobusfs_log(3,"Starting isobusfs-srv");
                      do {
                        wVar12 = libj1939_prepare_for_events
                                           ((libj1939_cmn *)&priv->cmn,(int *)&writeable_volumes,
                                            false);
                        if (wVar12 != L'\0') break;
                        uVar20 = (ulong)(int)writeable_volumes;
                        if (0 < (long)uVar20) {
                          lVar25 = 4;
                          for (uVar27 = 0;
                              (uVar20 != uVar27 && (uVar27 < (priv->cmn).epoll_events_size));
                              uVar27 = uVar27 + 1) {
                            peVar14 = (priv->cmn).epoll_events;
                            uVar11 = *(uint *)((long)peVar14 + lVar25 + -4);
                            if (uVar11 == 0) {
                              warn("no events");
                            }
                            else {
                              if (((uVar11 & 8) != 0) &&
                                 (wVar12 = *(wchar_t *)((long)&peVar14->events + lVar25),
                                 wVar12 == priv->sock_fss)) {
                                local_198[0].can_family = 0;
                                local_198[0]._2_2_ = 0;
                                local_198[0].can_ifindex = 0;
                                local_198[0].can_addr._0_4_ = 0;
                                local_198[0].can_addr._4_4_ = 0;
                                local_198[0].can_addr._8_8_ = &priv->st_msg_stats;
                                iVar10 = isobusfs_recv_err(wVar12,local_198);
                                if (iVar10 != 0) {
                                  isobusfs_log(2,"error queue reported error: %i",iVar10);
                                }
                                uVar11 = *(uint *)((long)peVar14 + lVar25 + -4);
                              }
                              if ((uVar11 & 1) != 0) {
                                iVar10 = *(int *)((long)&peVar14->events + lVar25);
                                msg = (isobusfs_msg *)malloc(0x10030);
                                if (msg == (isobusfs_msg *)0x0) {
                                  isobusfs_log(1,"can\'t allocate rx msg struct");
                                }
                                else {
                                  msg->buf_size = 0x10000;
                                  msg->peer_addr_len = 0x18;
                                  msg->sock = iVar10;
                                  uVar28 = recvfrom(iVar10,msg,0x10000,0,(sockaddr *)&msg->peername,
                                                    &msg->peer_addr_len);
                                  uVar11 = (uint)uVar28;
                                  if ((int)uVar11 < 0) {
                                    piVar15 = __errno_location();
                                    iVar10 = *piVar15;
                                    strerror(iVar10);
                                    isobusfs_log(1,"recvfrom(): %i (%s)",iVar10);
                                  }
                                  else if (uVar11 < 8) {
                                    isobusfs_log(2,
                                                 "buf is less then min transfer: %i < %i. Dropping."
                                                 ,uVar28 & 0xffffffff);
LAB_001031d9:
                                    isobusfs_send_nack(priv->sock_nack,msg);
                                  }
                                  else {
                                    msg->len = (ulong)(uVar11 & 0x7fffffff);
                                    _Var2 = (msg->peername).can_addr.j1939.pgn;
                                    if (_Var2 == 0xe800) {
                                      if (msg->buf[0] == '\x01') {
                                        isobusfs_log(4,"< rx: NACK!!!!!");
                                        isobusfs_dump_tx_data(&priv->tx_buf_log);
                                      }
                                      else {
                                        if (msg->buf[0] != '\0') {
                                          pcVar23 = "%s: unsupported ACK control: %i";
                                          pcVar22 = "isobusfs_srv_rx_ack";
                                          goto LAB_00103348;
                                        }
                                        isobusfs_log(4,"< rx: ACK?????");
                                      }
                                    }
                                    else {
                                      if (_Var2 == 0xaa00) {
                                        bVar1 = msg->buf[0];
                                        if (0x4f < bVar1) {
                                          isobusfs_log(2,"%s: unsupported command group (%i)",
                                                       "isobusfs_srv_rx_fs");
                                          goto LAB_001031d9;
                                        }
                                        piVar16 = isobusfs_srv_get_client
                                                            ((isobusfs_srv_priv *)priv,
                                                             (msg->peername).can_addr.j1939.addr);
                                        if (piVar16 == (isobusfs_srv_client *)0x0) {
                                          isobusfs_log(2,"%s: client not found","isobusfs_srv_rx_fs"
                                                      );
                                          goto LAB_0010334f;
                                        }
                                        msg->sock = piVar16->sock;
                                        switch(bVar1) {
                                        default:
                                          wVar12 = isobusfs_srv_rx_cg_cm
                                                             ((isobusfs_srv_priv *)priv,msg);
                                          break;
                                        case 0x10:
                                        case 0x11:
                                        case 0x12:
                                        case 0x13:
                                        case 0x14:
                                        case 0x15:
                                        case 0x16:
                                        case 0x17:
                                        case 0x18:
                                        case 0x19:
                                        case 0x1a:
                                        case 0x1b:
                                        case 0x1c:
                                        case 0x1d:
                                        case 0x1e:
                                        case 0x1f:
                                          wVar12 = isobusfs_srv_rx_cg_dh(priv,msg);
                                          break;
                                        case 0x20:
                                        case 0x21:
                                        case 0x22:
                                        case 0x23:
                                        case 0x24:
                                        case 0x25:
                                        case 0x26:
                                        case 0x27:
                                        case 0x28:
                                        case 0x29:
                                        case 0x2a:
                                        case 0x2b:
                                        case 0x2c:
                                        case 0x2d:
                                        case 0x2e:
                                        case 0x2f:
                                          wVar12 = isobusfs_srv_rx_cg_fa
                                                             ((isobusfs_srv_priv *)priv,msg);
                                          break;
                                        case 0x30:
                                        case 0x31:
                                        case 0x32:
                                        case 0x33:
                                        case 0x34:
                                        case 0x35:
                                        case 0x36:
                                        case 0x37:
                                        case 0x38:
                                        case 0x39:
                                        case 0x3a:
                                        case 0x3b:
                                        case 0x3c:
                                        case 0x3d:
                                        case 0x3e:
                                        case 0x3f:
                                          wVar12 = isobusfs_srv_rx_cg_fh
                                                             ((isobusfs_srv_priv *)priv,msg);
                                          break;
                                        case 0x40:
                                        case 0x41:
                                        case 0x42:
                                        case 0x43:
                                        case 0x44:
                                        case 0x45:
                                        case 0x46:
                                        case 0x47:
                                        case 0x48:
                                        case 0x49:
                                        case 0x4a:
                                        case 0x4b:
                                        case 0x4c:
                                        case 0x4d:
                                        case 0x4e:
                                        case 0x4f:
                                          wVar12 = isobusfs_srv_rx_cg_vh
                                                             ((isobusfs_srv_priv *)priv,msg);
                                        }
                                        uVar28 = (ulong)(uint)wVar12;
                                        if (L'\xffffffff' < wVar12) goto LAB_00103367;
                                      }
                                      else {
                                        pcVar23 = "%s: unsupported PGN: %i";
                                        pcVar22 = "isobusfs_srv_rx_buf";
LAB_00103348:
                                        isobusfs_log(2,pcVar23,pcVar22);
LAB_0010334f:
                                        uVar28 = 0xffffffffffffffea;
                                      }
                                      isobusfs_log(1,"unhandled error by rx buf: %i",uVar28);
                                    }
                                  }
LAB_00103367:
                                  free(msg);
                                }
                              }
                            }
                            lVar25 = lVar25 + 0xc;
                          }
                        }
                        isobusfs_srv_remove_timeouted_clients((isobusfs_srv_priv *)priv);
                        wVar12 = isobusfs_srv_fss_send((isobusfs_srv_priv *)priv);
                      } while (wVar12 == L'\0');
                      close((priv->cmn).epoll_fd);
                      free((priv->cmn).epoll_events);
                      close(priv->sock_fss);
                      close(priv->sock_in);
                      close(priv->sock_nack);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return wVar12;
}

Assistant:

int main(int argc, char *argv[])
{
	struct isobusfs_srv_priv *priv;
	struct timespec ts;
	int ret;

	/* Allocate memory for the private structure */
	priv = malloc(sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	/* Clear memory for the private structure */
	memset(priv, 0, sizeof(*priv));

	/* Initialize sockaddr_can with a non-configurable PGN */
	libj1939_init_sockaddr_can(&priv->addr, J1939_NO_PGN);

	priv->server_version = ISOBUSFS_SRV_VERSION;
	/* Parse command line arguments */
	ret = isobusfs_srv_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	/* Prepare sockets for the server */
	ret = isobusfs_srv_sock_prepare(priv);
	if (ret)
		return ret;

	/* Initialize File Server Status structure */
	isobusfs_srv_fss_init(priv);
	/* Initialize client structures */
	isobusfs_srv_init_clients(priv);

	/* Init next st_next_send_time value to avoid warnings */
	clock_gettime(CLOCK_MONOTONIC, &ts);
	priv->cmn.next_send_time = ts;

	/* Start the isobusfsd server */
	pr_info("Starting isobusfs-srv");
	while (1) {
		ret = isobusfs_srv_process_events_and_tasks(priv);
		if (ret)
			break;
	}

	/* Close epoll and control sockets */
	close(priv->cmn.epoll_fd);
	free(priv->cmn.epoll_events);
	close(priv->sock_fss);
	close(priv->sock_in);
	close(priv->sock_nack);

	return ret;
}